

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

int __thiscall AlsaBackendFactory::init(AlsaBackendFactory *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  FILE *__stream;
  ulong in_RAX;
  undefined8 uVar2;
  string missing_funcs;
  bool error;
  char *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  char *name;
  void *in_stack_fffffffffffffd80;
  void *handle;
  string local_38 [39];
  byte local_11;
  AlsaBackendFactory *local_10;
  undefined1 local_1;
  
  local_11 = 0;
  if ((anonymous_namespace)::alsa_handle == (void *)0x0) {
    local_10 = this;
    std::__cxx11::string::string(local_38);
    (anonymous_namespace)::alsa_handle = LoadLib(in_stack_fffffffffffffd70);
    if ((anonymous_namespace)::alsa_handle == (void *)0x0) {
      if (1 < (int)gLogLevel) {
        fprintf((FILE *)gLogFile,"[ALSOFT] (WW) Failed to load %s\n","libasound.so.2");
      }
      local_1 = 0;
      bVar1 = true;
    }
    else {
      local_11 = 0;
      (anonymous_namespace)::psnd_strerror =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_strerror == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_strerror");
      }
      (anonymous_namespace)::psnd_pcm_open =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_open == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_open");
      }
      (anonymous_namespace)::psnd_pcm_close =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_close == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_close");
      }
      (anonymous_namespace)::psnd_pcm_nonblock =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_nonblock == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_nonblock");
      }
      (anonymous_namespace)::psnd_pcm_frames_to_bytes =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_frames_to_bytes == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_frames_to_bytes");
      }
      (anonymous_namespace)::psnd_pcm_bytes_to_frames =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_bytes_to_frames == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_bytes_to_frames");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_malloc =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_malloc == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_malloc");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_free =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_free == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_free");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_any =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_any == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_any");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_current =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_current == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_current");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_access =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_access == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_access");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_format =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_format == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_format");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_channels =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_channels == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_channels");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_periods_near =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_periods_near == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_periods_near");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_rate_near =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_rate_near == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_rate_near");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_rate =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_rate == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_rate");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_rate_resample =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_rate_resample == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_rate_resample");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_time_near =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_buffer_time_near == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_buffer_time_near");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_period_time_near =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_period_time_near == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_period_time_near");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_near =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_near == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_buffer_size_near");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_period_size_near =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_period_size_near == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_period_size_near");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_min =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_set_buffer_size_min == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_set_buffer_size_min");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_min =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_min == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_buffer_time_min");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_max =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_buffer_time_max == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_buffer_time_max");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_period_time_min =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_period_time_min == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_period_time_min");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_period_time_max =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_period_time_max == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_period_time_max");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_buffer_size =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_buffer_size == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_buffer_size");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_period_size =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_period_size == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_period_size");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_access =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_access == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_access");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_get_periods =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_get_periods == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_get_periods");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_test_format =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_test_format == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_test_format");
      }
      (anonymous_namespace)::psnd_pcm_hw_params_test_channels =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params_test_channels == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params_test_channels");
      }
      (anonymous_namespace)::psnd_pcm_hw_params =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_hw_params == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_hw_params");
      }
      (anonymous_namespace)::psnd_pcm_sw_params_malloc =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_sw_params_malloc == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_sw_params_malloc");
      }
      (anonymous_namespace)::psnd_pcm_sw_params_current =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_sw_params_current == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_sw_params_current");
      }
      (anonymous_namespace)::psnd_pcm_sw_params_set_avail_min =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_sw_params_set_avail_min == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_sw_params_set_avail_min");
      }
      (anonymous_namespace)::psnd_pcm_sw_params_set_stop_threshold =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_sw_params_set_stop_threshold == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_sw_params_set_stop_threshold");
      }
      (anonymous_namespace)::psnd_pcm_sw_params =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_sw_params == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_sw_params");
      }
      (anonymous_namespace)::psnd_pcm_sw_params_free =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_sw_params_free == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_sw_params_free");
      }
      (anonymous_namespace)::psnd_pcm_prepare =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_prepare == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_prepare");
      }
      (anonymous_namespace)::psnd_pcm_start =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_start == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_start");
      }
      (anonymous_namespace)::psnd_pcm_resume =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_resume == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_resume");
      }
      (anonymous_namespace)::psnd_pcm_reset =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_reset == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_reset");
      }
      (anonymous_namespace)::psnd_pcm_wait =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_wait == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_wait");
      }
      (anonymous_namespace)::psnd_pcm_delay =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_delay == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_delay");
      }
      (anonymous_namespace)::psnd_pcm_state =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_state == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_state");
      }
      (anonymous_namespace)::psnd_pcm_avail_update =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_avail_update == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_avail_update");
      }
      (anonymous_namespace)::psnd_pcm_areas_silence =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_areas_silence == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_areas_silence");
      }
      (anonymous_namespace)::psnd_pcm_mmap_begin =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_mmap_begin == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_mmap_begin");
      }
      (anonymous_namespace)::psnd_pcm_mmap_commit =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_mmap_commit == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_mmap_commit");
      }
      (anonymous_namespace)::psnd_pcm_readi =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_readi == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_readi");
      }
      (anonymous_namespace)::psnd_pcm_writei =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_writei == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_writei");
      }
      (anonymous_namespace)::psnd_pcm_drain =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_drain == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_drain");
      }
      (anonymous_namespace)::psnd_pcm_drop =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_drop == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_drop");
      }
      (anonymous_namespace)::psnd_pcm_recover =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_recover == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_recover");
      }
      (anonymous_namespace)::psnd_pcm_info_malloc =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_info_malloc == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_info_malloc");
      }
      (anonymous_namespace)::psnd_pcm_info_free =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_info_free == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_info_free");
      }
      (anonymous_namespace)::psnd_pcm_info_set_device =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_info_set_device == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_info_set_device");
      }
      (anonymous_namespace)::psnd_pcm_info_set_subdevice =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_info_set_subdevice == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_info_set_subdevice");
      }
      (anonymous_namespace)::psnd_pcm_info_set_stream =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_info_set_stream == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_info_set_stream");
      }
      (anonymous_namespace)::psnd_pcm_info_get_name =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_pcm_info_get_name == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_pcm_info_get_name");
      }
      (anonymous_namespace)::psnd_ctl_pcm_next_device =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_pcm_next_device == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_pcm_next_device");
      }
      (anonymous_namespace)::psnd_ctl_pcm_info =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_pcm_info == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_pcm_info");
      }
      (anonymous_namespace)::psnd_ctl_open =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_open == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_open");
      }
      (anonymous_namespace)::psnd_ctl_close =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_close == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_close");
      }
      (anonymous_namespace)::psnd_ctl_card_info_malloc =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_card_info_malloc == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_card_info_malloc");
      }
      (anonymous_namespace)::psnd_ctl_card_info_free =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_card_info_free == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_card_info_free");
      }
      (anonymous_namespace)::psnd_ctl_card_info =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_card_info == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_card_info");
      }
      (anonymous_namespace)::psnd_ctl_card_info_get_name =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      if ((anonymous_namespace)::psnd_ctl_card_info_get_name == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_card_info_get_name");
      }
      (anonymous_namespace)::psnd_ctl_card_info_get_id =
           GetSymbol(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      handle = (anonymous_namespace)::psnd_ctl_card_info_get_id;
      if ((anonymous_namespace)::psnd_ctl_card_info_get_id == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_ctl_card_info_get_id");
      }
      (anonymous_namespace)::psnd_card_next = (char *)GetSymbol(handle,in_stack_fffffffffffffd78);
      name = (anonymous_namespace)::psnd_card_next;
      if ((anonymous_namespace)::psnd_card_next == (char *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_card_next");
      }
      (anonymous_namespace)::psnd_config_update_free_global = GetSymbol(handle,name);
      if ((anonymous_namespace)::psnd_config_update_free_global == (void *)0x0) {
        local_11 = 1;
        std::__cxx11::string::operator+=(local_38,"\nsnd_config_update_free_global");
      }
      __stream = gLogFile;
      if ((local_11 & 1) != 0) {
        if (1 < (int)gLogLevel) {
          uVar2 = std::__cxx11::string::c_str();
          fprintf((FILE *)__stream,"[ALSOFT] (WW) Missing expected functions:%s\n",uVar2);
        }
        CloseLib((void *)0x22cc6c);
        (anonymous_namespace)::alsa_handle = (void *)0x0;
      }
      bVar1 = false;
    }
    std::__cxx11::string::~string(local_38);
    in_RAX = 0;
    if (bVar1) goto LAB_0022ccb4;
  }
  in_RAX = (CONCAT71((int7)(in_RAX >> 8),local_11) ^ 0xff) & 0xffffffffffffff01;
  local_1 = (undefined1)in_RAX;
LAB_0022ccb4:
  return (uint)CONCAT71((int7)(in_RAX >> 8),local_1) & 0xffffff01;
}

Assistant:

bool AlsaBackendFactory::init()
{
    bool error{false};

#ifdef HAVE_DYNLOAD
    if(!alsa_handle)
    {
        std::string missing_funcs;

        alsa_handle = LoadLib("libasound.so.2");
        if(!alsa_handle)
        {
            WARN("Failed to load %s\n", "libasound.so.2");
            return ALC_FALSE;
        }

        error = ALC_FALSE;
#define LOAD_FUNC(f) do {                                                     \
    p##f = reinterpret_cast<decltype(p##f)>(GetSymbol(alsa_handle, #f));      \
    if(p##f == nullptr) {                                                     \
        error = true;                                                         \
        missing_funcs += "\n" #f;                                             \
    }                                                                         \
} while(0)
        ALSA_FUNCS(LOAD_FUNC);
#undef LOAD_FUNC

        if(error)
        {
            WARN("Missing expected functions:%s\n", missing_funcs.c_str());
            CloseLib(alsa_handle);
            alsa_handle = nullptr;
        }
    }
#endif

    return !error;
}